

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper::
initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper
          (initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper *this,
          TestDetails *details)

{
  TestDetails *details_local;
  initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper *this_local;
  
  initiatorFixture::initiatorFixture(&this->super_initiatorFixture);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder =
       (_func_int **)
       &PTR__initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper_00463b58;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)
       &PTR__initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper_00463bb0;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_AResentMessageReceivesADoNotSendException) {
  startLoggedOn();

  FIX::Message neworder1 = createNewOrderSingle("ISLD", "TW", 2);
  object->send(neworder1);

  FIX::Message neworder2 = createNewOrderSingle("ISLD", "TW", 3);
  neworder2.setField(FIX::Text("DoNotSend"));
  object->send(neworder2);

  this->checkForDoNotSend = true;

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 8);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(5, object->getExpectedSenderNum());
  CHECK_EQUAL(3, object->getExpectedTargetNum());
}